

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::PlainGatherUint2D::Verify(PlainGatherUint2D *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  IVec4 data;
  int aiStack_14 [3];
  
  data.m_data[0] = 0;
  data.m_data[1] = 0;
  data.m_data[2] = 0;
  data.m_data[3] = 0;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,1,1,0x8d99,0x1405,&data);
  aiStack_14[1] = 10;
  aiStack_14[2] = 0xe;
  if (data.m_data[0] == 2) {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 2) {
        uVar4 = 3;
        break;
      }
      lVar1 = uVar3 + 2;
      uVar4 = uVar3 + 1;
      lVar2 = uVar3 + 1;
      uVar3 = uVar4;
    } while (data.m_data[lVar1] == aiStack_14[lVar2]);
    if (2 < uVar4) {
      return 0;
    }
  }
  anon_unknown_0::Output
            ("Expected 2, 6, 10, 14, got: %d, %d, %d, %d",data.m_data._0_8_ & 0xffffffff,
             (ulong)data.m_data._0_8_ >> 0x20,data.m_data._8_8_ & 0xffffffff,
             (ulong)data.m_data._8_8_ >> 0x20);
  return -1;
}

Assistant:

GLuint CreateComputeProgram(const std::string& cs)
	{
		const GLuint p = glCreateProgram();

		if (!cs.empty())
		{
			const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[1] = { cs.c_str() };
			glShaderSource(sh, 1, src, NULL);
			glCompileShader(sh);
		}

		return p;
	}